

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O2

Ref<embree::XML> __thiscall embree::XML::child(XML *this,size_t id)

{
  _func_int **pp_Var1;
  runtime_error *this_00;
  ulong in_RDX;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (in_RDX < (ulong)(*(long *)(id + 0x88) - *(long *)(id + 0x80) >> 3)) {
    pp_Var1 = *(_func_int ***)(*(long *)(id + 0x80) + in_RDX * 8);
    (this->super_RefCount)._vptr_RefCount = pp_Var1;
    if (pp_Var1 != (_func_int **)0x0) {
      (**(code **)(*pp_Var1 + 0x10))();
    }
    return (Ref<embree::XML>)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_a0,(ParseLocation *)(id + 0x10));
  std::operator+(&local_80,&local_a0,": XML node has no child \"");
  std::__cxx11::to_string(&local_c0,in_RDX);
  std::operator+(&local_60,&local_80,&local_c0);
  std::operator+(&local_40,&local_60,"\"");
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Ref<XML> child(const size_t id) const 
    {
      if (id >= children.size()) 
        THROW_RUNTIME_ERROR (loc.str()+": XML node has no child \"" + toString(id) + "\"");
      return children[id];
    }